

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O3

int value_from_picture_or_in_proc(Am_Object *self)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  Am_Value *pAVar4;
  Am_Value v;
  Am_Object local_20;
  Am_Value local_18;
  
  local_18.type = 0;
  local_18.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)INPUT_1);
  Am_Value::operator=(&local_18,pAVar4);
  cVar1 = Am_Value::Valid();
  if (cVar1 == '\0') {
    Am_Object::Get_Object((ushort)&local_20,(ulong)self);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)&local_20,0x169);
    Am_Value::operator=(&local_18,pAVar4);
    Am_Object::~Am_Object(&local_20);
    bVar2 = Am_Value::Valid();
    uVar3 = (uint)bVar2;
  }
  else {
    uVar3 = get_value_end_of(self,INPUT_1);
  }
  Am_Value::~Am_Value(&local_18);
  return uVar3;
}

Assistant:

Am_Define_Formula(int, value_from_picture_or_in) {
  Am_Value v;
  v = self.Peek(INPUT_1); //check if in wire; if so, return its value
  if (v.Valid()) return get_value_end_of(self, INPUT_1);
  else {
    v = self.Get_Object(PICTURE).Peek(Am_VALUE);
    return (v.Valid());
  }
}